

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O3

Element_p __thiscall indigox::PeriodicTable::GetElement(PeriodicTable *this,string *name)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  String *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Element_p EVar4;
  string u;
  String local_48;
  
  utils::toUpperFirst(&local_48,in_RDX);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
                  *)&name[1].field_2,&local_48);
  if (cVar1._M_node == (_Base_ptr)((long)&name[1].field_2 + 8)) {
    *(undefined8 *)&(this->z_to_)._M_t._M_impl = 0;
    *(undefined8 *)&(this->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
                   *)&name[1].field_2,in_RDX);
    std::__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> *)this,pmVar2);
    _Var3._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  EVar4.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  EVar4.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Element_p)EVar4.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element_p PeriodicTable::GetElement(std::string name) const {
    std::string u = utils::toUpperFirst(&name);
    if (name_to_.find(u) != name_to_.end()) {
      return name_to_.at(name).lock();
    }
    return Element_p();
  }